

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.cpp
# Opt level: O2

void __thiscall
llvm::SmallVectorBase::grow_pod(SmallVectorBase *this,void *FirstEl,size_t MinCapacity,size_t TSize)

{
  ulong uVar1;
  void *__dest;
  
  if (MinCapacity >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar1 = (ulong)this->Capacity * 2 + 1;
  if (MinCapacity < uVar1) {
    MinCapacity = uVar1;
  }
  if (0xfffffffe < MinCapacity) {
    MinCapacity = 0xffffffff;
  }
  if (this->BeginX == FirstEl) {
    __dest = safe_malloc(MinCapacity * TSize);
    memcpy(__dest,this->BeginX,this->Size * TSize);
  }
  else {
    __dest = safe_realloc(this->BeginX,MinCapacity * TSize);
  }
  this->BeginX = __dest;
  this->Capacity = (uint)MinCapacity;
  return;
}

Assistant:

void SmallVectorBase::grow_pod(void *FirstEl, size_t MinCapacity,
                               size_t TSize) {
  // Ensure we can fit the new capacity in 32 bits.
  if (MinCapacity > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  size_t NewCapacity = 2 * capacity() + 1; // Always grow.
  NewCapacity =
      std::min(std::max(NewCapacity, MinCapacity), size_t(UINT32_MAX));

  void *NewElts;
  if (BeginX == FirstEl) {
    NewElts = safe_malloc(NewCapacity * TSize);

    // Copy the elements over.  No need to run dtors on PODs.
    memcpy(NewElts, this->BeginX, size() * TSize);
  } else {
    // If this wasn't grown from the inline copy, grow the allocated space.
    NewElts = safe_realloc(this->BeginX, NewCapacity * TSize);
  }

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}